

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int __thiscall
ON_BinaryArchive::Read3dmModelGeometryForExperts
          (ON_BinaryArchive *this,bool bManageGeometry,bool bManageAttributes,
          ON_ModelGeometryComponent **model_geometry,uint object_filter)

{
  int iVar1;
  ON_3dmObjectAttributes *this_00;
  ON_Object *geometry_object;
  ON_ModelGeometryComponent *pOVar2;
  ON_Geometry *geometry;
  int rc;
  ON_3dmObjectAttributes *attributes;
  ON_Object *p;
  ON_ModelGeometryComponent **ppOStack_20;
  uint object_filter_local;
  ON_ModelGeometryComponent **model_geometry_local;
  bool bManageAttributes_local;
  ON_BinaryArchive *pOStack_10;
  bool bManageGeometry_local;
  ON_BinaryArchive *this_local;
  
  if (model_geometry != (ON_ModelGeometryComponent **)0x0) {
    *model_geometry = (ON_ModelGeometryComponent *)0x0;
  }
  attributes = (ON_3dmObjectAttributes *)0x0;
  p._4_4_ = object_filter;
  ppOStack_20 = model_geometry;
  model_geometry_local._6_1_ = bManageAttributes;
  model_geometry_local._7_1_ = bManageGeometry;
  pOStack_10 = this;
  this_00 = (ON_3dmObjectAttributes *)operator_new(0x170);
  ON_3dmObjectAttributes::ON_3dmObjectAttributes(this_00);
  iVar1 = Read3dmObject(this,(ON_Object **)&attributes,this_00,p._4_4_);
  geometry_object = &ON_Geometry::Cast(&attributes->super_ON_Object)->super_ON_Object;
  if ((iVar1 == 1) && (geometry_object != (ON_Object *)0x0)) {
    pOVar2 = ON_ModelGeometryComponent::CreateForExperts
                       ((bool)(model_geometry_local._7_1_ & 1),geometry_object,
                        (bool)(model_geometry_local._6_1_ & 1),this_00,
                        (ON_ModelGeometryComponent *)0x0);
    *ppOStack_20 = pOVar2;
  }
  else {
    if (attributes != (ON_3dmObjectAttributes *)0x0) {
      (*(attributes->super_ON_Object)._vptr_ON_Object[4])();
    }
    if (this_00 != (ON_3dmObjectAttributes *)0x0) {
      (*(this_00->super_ON_Object)._vptr_ON_Object[4])();
    }
  }
  return iVar1;
}

Assistant:

int ON_BinaryArchive::Read3dmModelGeometryForExperts(
  bool bManageGeometry,
  bool bManageAttributes,
  class ON_ModelGeometryComponent** model_geometry,
  unsigned int object_filter
)
{
  if ( nullptr != model_geometry )
    *model_geometry = nullptr;
  ON_Object* p = nullptr;
  ON_3dmObjectAttributes* attributes = new ON_3dmObjectAttributes();
  int rc = Read3dmObject(&p, attributes, object_filter);
  ON_Geometry* geometry = ON_Geometry::Cast(p);
  if (1 == rc && nullptr != geometry)
  {
    *model_geometry = ON_ModelGeometryComponent::CreateForExperts(bManageGeometry,geometry,bManageAttributes,attributes,nullptr);
  }
  else
  {
    delete p;
    delete attributes;
  }
  return rc;
}